

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_buffer(Curl_send_buffer **inp,void *inptr,size_t size)

{
  Curl_send_buffer *pCVar1;
  size_t local_40;
  size_t new_size;
  Curl_send_buffer *in;
  char *new_rb;
  size_t size_local;
  void *inptr_local;
  Curl_send_buffer **inp_local;
  
  pCVar1 = *inp;
  if ((size ^ 0xffffffffffffffff) < pCVar1->size_used) {
    (*Curl_cfree)(pCVar1->buffer);
    pCVar1->buffer = (char *)0x0;
    (*Curl_cfree)(pCVar1);
    *inp = (Curl_send_buffer *)0x0;
    inp_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((pCVar1->buffer == (char *)0x0) || (pCVar1->size_max - 1 < pCVar1->size_used + size)) {
      if ((size < 0x8000000000000000) &&
         ((pCVar1->size_used < 0x8000000000000000 &&
          (pCVar1->size_used << 1 <= (size << 1 ^ 0xffffffffffffffff))))) {
        local_40 = (pCVar1->size_used + size) * 2;
      }
      else {
        local_40 = 0xffffffffffffffff;
      }
      if (pCVar1->buffer == (char *)0x0) {
        in = (Curl_send_buffer *)(*Curl_cmalloc)(local_40);
      }
      else {
        in = (Curl_send_buffer *)Curl_saferealloc(pCVar1->buffer,local_40);
      }
      if (in == (Curl_send_buffer *)0x0) {
        (*Curl_cfree)(pCVar1);
        *inp = (Curl_send_buffer *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      pCVar1->buffer = (char *)in;
      pCVar1->size_max = local_40;
    }
    memcpy(pCVar1->buffer + pCVar1->size_used,inptr,size);
    pCVar1->size_used = size + pCVar1->size_used;
    inp_local._4_4_ = CURLE_OK;
  }
  return inp_local._4_4_;
}

Assistant:

CURLcode Curl_add_buffer(Curl_send_buffer **inp, const void *inptr,
                         size_t size)
{
  char *new_rb;
  Curl_send_buffer *in = *inp;

  if(~size < in->size_used) {
    /* If resulting used size of send buffer would wrap size_t, cleanup
       the whole buffer and return error. Otherwise the required buffer
       size will fit into a single allocatable memory chunk */
    Curl_safefree(in->buffer);
    free(in);
    *inp = NULL;
    return CURLE_OUT_OF_MEMORY;
  }

  if(!in->buffer ||
     ((in->size_used + size) > (in->size_max - 1))) {
    /* If current buffer size isn't enough to hold the result, use a
       buffer size that doubles the required size. If this new size
       would wrap size_t, then just use the largest possible one */
    size_t new_size;

    if((size > (size_t)-1 / 2) || (in->size_used > (size_t)-1 / 2) ||
       (~(size * 2) < (in->size_used * 2)))
      new_size = (size_t)-1;
    else
      new_size = (in->size_used + size) * 2;

    if(in->buffer)
      /* we have a buffer, enlarge the existing one */
      new_rb = Curl_saferealloc(in->buffer, new_size);
    else
      /* create a new buffer */
      new_rb = malloc(new_size);

    if(!new_rb) {
      /* If we failed, we cleanup the whole buffer and return error */
      free(in);
      *inp = NULL;
      return CURLE_OUT_OF_MEMORY;
    }

    in->buffer = new_rb;
    in->size_max = new_size;
  }
  memcpy(&in->buffer[in->size_used], inptr, size);

  in->size_used += size;

  return CURLE_OK;
}